

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,bool *variable,string *value)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)value);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)value);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)value);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)value);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)value);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)value);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)value);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)value);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)value);
                    bVar2 = iVar1 == 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *variable = bVar2;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(bool* variable,
                                            const std::string& value)
{
  if (value == "1" || value == "ON" || value == "on" || value == "On" ||
      value == "TRUE" || value == "true" || value == "True" ||
      value == "yes" || value == "Yes" || value == "YES") {
    *variable = true;
  } else {
    *variable = false;
  }
}